

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::computeFields(Calendar *this,UErrorCode *ec)

{
  UBool UVar1;
  TimeZone *pTVar2;
  int iVar3;
  double dVar4;
  int32_t millisInDay;
  int32_t days;
  int32_t i;
  uint32_t mask;
  int32_t dstOffset;
  int32_t rawOffset;
  double localMillis;
  UErrorCode *ec_local;
  Calendar *this_local;
  
  localMillis = (double)ec;
  ec_local = (UErrorCode *)this;
  UVar1 = ::U_FAILURE(*ec);
  if (UVar1 == '\0') {
    _dstOffset = internalGetTime(this);
    pTVar2 = getTimeZone(this);
    (*(pTVar2->super_UObject)._vptr_UObject[6])(_dstOffset,pTVar2,0,&mask,&i,localMillis);
    _dstOffset = (double)(int)(mask + i) + _dstOffset;
    days = 0x80067;
    for (millisInDay = 0; millisInDay < 0x17; millisInDay = millisInDay + 1) {
      if ((days & 1U) == 0) {
        this->fStamp[millisInDay] = 1;
        this->fIsSet[millisInDay] = '\x01';
      }
      else {
        this->fStamp[millisInDay] = 0;
        this->fIsSet[millisInDay] = '\0';
      }
      days = (uint)days >> 1;
    }
    dVar4 = ClockMath::floorDivide(_dstOffset,86400000.0);
    internalSet(this,UCAL_JULIAN_DAY,(int)dVar4 + 0x253d8c);
    computeGregorianAndDOWFields(this,this->fFields[0x14],(UErrorCode *)localMillis);
    (*(this->super_UObject)._vptr_UObject[0x29])(this,(ulong)(uint)this->fFields[0x14],localMillis);
    computeWeekFields(this,(UErrorCode *)localMillis);
    iVar3 = (int)(-(double)(int)dVar4 * 86400000.0 + _dstOffset);
    this->fFields[0x15] = iVar3;
    this->fFields[0xe] = iVar3 % 1000;
    this->fFields[0xd] = (iVar3 / 1000) % 0x3c;
    iVar3 = (iVar3 / 1000) / 0x3c;
    this->fFields[0xc] = iVar3 % 0x3c;
    iVar3 = iVar3 / 0x3c;
    this->fFields[0xb] = iVar3;
    this->fFields[9] = iVar3 / 0xc;
    this->fFields[10] = iVar3 % 0xc;
    this->fFields[0xf] = mask;
    this->fFields[0x10] = i;
  }
  return;
}

Assistant:

void Calendar::computeFields(UErrorCode &ec)
{
  if (U_FAILURE(ec)) {
        return;
    }
    // Compute local wall millis
    double localMillis = internalGetTime();
    int32_t rawOffset, dstOffset;
    getTimeZone().getOffset(localMillis, FALSE, rawOffset, dstOffset, ec);
    localMillis += (rawOffset + dstOffset);

    // Mark fields as set.  Do this before calling handleComputeFields().
    uint32_t mask =   //fInternalSetMask;
        (1 << UCAL_ERA) |
        (1 << UCAL_YEAR) |
        (1 << UCAL_MONTH) |
        (1 << UCAL_DAY_OF_MONTH) | // = UCAL_DATE
        (1 << UCAL_DAY_OF_YEAR) |
        (1 << UCAL_EXTENDED_YEAR);

    for (int32_t i=0; i<UCAL_FIELD_COUNT; ++i) {
        if ((mask & 1) == 0) {
            fStamp[i] = kInternallySet;
            fIsSet[i] = TRUE; // Remove later
        } else {
            fStamp[i] = kUnset;
            fIsSet[i] = FALSE; // Remove later
        }
        mask >>= 1;
    }

    // We used to check for and correct extreme millis values (near
    // Long.MIN_VALUE or Long.MAX_VALUE) here.  Such values would cause
    // overflows from positive to negative (or vice versa) and had to
    // be manually tweaked.  We no longer need to do this because we
    // have limited the range of supported dates to those that have a
    // Julian day that fits into an int.  This allows us to implement a
    // JULIAN_DAY field and also removes some inelegant code. - Liu
    // 11/6/00

    int32_t days =  (int32_t)ClockMath::floorDivide(localMillis, (double)kOneDay);

    internalSet(UCAL_JULIAN_DAY,days + kEpochStartAsJulianDay);

#if defined (U_DEBUG_CAL)
    //fprintf(stderr, "%s:%d- Hmm! Jules @ %d, as per %.0lf millis\n",
    //__FILE__, __LINE__, fFields[UCAL_JULIAN_DAY], localMillis);
#endif

    computeGregorianAndDOWFields(fFields[UCAL_JULIAN_DAY], ec);

    // Call framework method to have subclass compute its fields.
    // These must include, at a minimum, MONTH, DAY_OF_MONTH,
    // EXTENDED_YEAR, YEAR, DAY_OF_YEAR.  This method will call internalSet(),
    // which will update stamp[].
    handleComputeFields(fFields[UCAL_JULIAN_DAY], ec);

    // Compute week-related fields, based on the subclass-computed
    // fields computed by handleComputeFields().
    computeWeekFields(ec);

    // Compute time-related fields.  These are indepent of the date and
    // of the subclass algorithm.  They depend only on the local zone
    // wall milliseconds in day.
    int32_t millisInDay =  (int32_t) (localMillis - (days * kOneDay));
    fFields[UCAL_MILLISECONDS_IN_DAY] = millisInDay;
    fFields[UCAL_MILLISECOND] = millisInDay % 1000;
    millisInDay /= 1000;
    fFields[UCAL_SECOND] = millisInDay % 60;
    millisInDay /= 60;
    fFields[UCAL_MINUTE] = millisInDay % 60;
    millisInDay /= 60;
    fFields[UCAL_HOUR_OF_DAY] = millisInDay;
    fFields[UCAL_AM_PM] = millisInDay / 12; // Assume AM == 0
    fFields[UCAL_HOUR] = millisInDay % 12;
    fFields[UCAL_ZONE_OFFSET] = rawOffset;
    fFields[UCAL_DST_OFFSET] = dstOffset;
}